

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void crnlib::crn_threading_init(void)

{
  int iVar1;
  int iVar2;
  
  iVar1 = get_nprocs();
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  g_number_of_processors = 0x10;
  if (iVar2 < 0x10) {
    g_number_of_processors = iVar2;
  }
  return;
}

Assistant:

void crn_threading_init() {
#ifdef WIN32
  SYSTEM_INFO g_system_info;
  GetSystemInfo(&g_system_info);
  g_number_of_processors = math::maximum<uint>(1U, g_system_info.dwNumberOfProcessors);
#elif defined(__FreeBSD__) || defined(__APPLE__)
  g_number_of_processors = math::maximum<int>(1, sysconf(_SC_NPROCESSORS_ONLN));
#elif defined(__GNUC__)
  g_number_of_processors = math::maximum<int>(1, get_nprocs());
#endif
  g_number_of_processors = math::minimum<int>(g_number_of_processors, task_pool::cMaxThreads);
}